

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int mem_query(lua_State *L)

{
  int iVar1;
  char *__s1;
  int local_2c;
  int i;
  char *t;
  unsigned_long limit;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_pushinteger(L,l_memcontrol.total);
    lua_pushinteger(L,l_memcontrol.numblocks);
    lua_pushinteger(L,l_memcontrol.maxmem);
    L_local._4_4_ = 3;
  }
  else {
    iVar1 = lua_isnumber(L,1);
    if (iVar1 == 0) {
      __s1 = luaL_checklstring(L,1,(size_t *)0x0);
      for (local_2c = 8; -1 < local_2c; local_2c = local_2c + -1) {
        iVar1 = strcmp(__s1,luaT_typenames_[local_2c + 1]);
        if (iVar1 == 0) {
          lua_pushinteger(L,l_memcontrol.objcount[local_2c]);
          return 1;
        }
      }
      L_local._4_4_ = luaL_error(L,"unknown type \'%s\'",__s1);
    }
    else {
      t = (char *)luaL_checkinteger(L,1);
      if (t == (char *)0x0) {
        t = (char *)0xffffffffffffffff;
      }
      l_memcontrol.memlimit = (unsigned_long)t;
      L_local._4_4_ = 0;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int mem_query (lua_State *L) {
  if (lua_isnone(L, 1)) {
    lua_pushinteger(L, l_memcontrol.total);
    lua_pushinteger(L, l_memcontrol.numblocks);
    lua_pushinteger(L, l_memcontrol.maxmem);
    return 3;
  }
  else if (lua_isnumber(L, 1)) {
    unsigned long limit = cast(unsigned long, luaL_checkinteger(L, 1));
    if (limit == 0) limit = ULONG_MAX;
    l_memcontrol.memlimit = limit;
    return 0;
  }
  else {
    const char *t = luaL_checkstring(L, 1);
    int i;
    for (i = LUA_NUMTAGS - 1; i >= 0; i--) {
      if (strcmp(t, ttypename(i)) == 0) {
        lua_pushinteger(L, l_memcontrol.objcount[i]);
        return 1;
      }
    }
    return luaL_error(L, "unknown type '%s'", t);
  }
}